

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primality-test-baseline.c
# Opt level: O1

uint64_t gaISubMod(uint64_t a,uint64_t b,uint64_t m)

{
  uint64_t uVar1;
  
  uVar1 = 0;
  if (a % m < b % m) {
    uVar1 = m;
  }
  return (a % m - b % m) + uVar1;
}

Assistant:

uint64_t gaISubMod    (uint64_t a, uint64_t b, uint64_t m){
	a %= m;
	b %= m;

	if(a >= b){
		return a-b;
	}else{
		return a-b+m;
	}
}